

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_> __thiscall
FBX::Parser::parseScene(Parser *this)

{
  Node *pNVar1;
  long lVar2;
  long lVar3;
  Vector3 up;
  bool bVar4;
  reference pvVar5;
  size_type sVar6;
  Texture *this_00;
  Material *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  Model *this_02;
  vector<FBX::Node,_std::allocator<FBX::Node>_> *this_03;
  reference pNVar8;
  const_reference pvVar9;
  long *plVar10;
  __shared_ptr_access<FBX::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_04;
  __shared_ptr_access<FBX::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_05;
  element_type *peVar11;
  __shared_ptr_access<FBX::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_06;
  element_type *peVar12;
  __shared_ptr_access<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_07;
  element_type *peVar13;
  element_type *peVar14;
  Node *in_RSI;
  __shared_ptr_access<FBX::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_4f8;
  shared_ptr<FBX::Model> *model_1;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *__range3_2;
  shared_ptr<FBX::Mesh> *mesh;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_> *__range2_1;
  shared_ptr<FBX::Model> *model;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *__range3_1;
  shared_ptr<FBX::Texture> *texture;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_> *__range3;
  shared_ptr<FBX::Material> *material;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_> *__range2
  ;
  long target;
  long source;
  Node *node_4;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  vector<FBX::Node,_std::allocator<FBX::Node>_> *__range1_4;
  reference local_420;
  Node *node_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<FBX::Node,_std::allocator<FBX::Node>_> *__range1_3;
  vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> models;
  pointer local_3d8;
  float local_3d0;
  undefined1 local_3c8 [24];
  Node *node_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<FBX::Node,_std::allocator<FBX::Node>_> *__range1_2;
  vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_> meshes;
  Node *node_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<FBX::Node,_std::allocator<FBX::Node>_> *__range1_1;
  vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_> materials
  ;
  Node *node;
  const_iterator __end1;
  const_iterator __begin1;
  vector<FBX::Node,_std::allocator<FBX::Node>_> *__range1;
  vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_> textures;
  allocator<char> local_2f1;
  string local_2f0;
  undefined1 local_2d0 [8];
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeTextures;
  string local_2b0;
  undefined1 local_290 [8];
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeMaterials;
  string local_270;
  undefined1 local_250 [8];
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeGeometry;
  string local_230;
  undefined1 local_210 [8];
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeModels;
  string local_1f0;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_1d0;
  undefined1 local_1b8 [8];
  value_type nodeConnections;
  string local_150;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_130;
  undefined1 local_118 [8];
  value_type nodeObjects;
  allocator<char> local_a1;
  string local_a0;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_80;
  undefined1 local_68 [8];
  Settings settings;
  Parser *this_local;
  
  pNVar1 = (Node *)in_RSI->propertyCount;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"GlobalSettings",&local_a1)
  ;
  findNodes(&local_80,pNVar1,&local_a0);
  pvVar5 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::operator[](&local_80,0);
  Settings::Settings((Settings *)local_68,pvVar5);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pNVar1 = (Node *)in_RSI->propertyCount;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"Objects",
             (allocator<char> *)
             ((long)&nodeConnections.properties.
                     super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  findNodes(&local_130,pNVar1,&local_150);
  pvVar5 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::operator[](&local_130,0);
  Node::Node((Node *)local_118,pvVar5);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&nodeConnections.properties.
                     super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pNVar1 = (Node *)in_RSI->propertyCount;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Connections",
             (allocator<char> *)
             ((long)&nodeModels.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  findNodes(&local_1d0,pNVar1,&local_1f0);
  pvVar5 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::operator[](&local_1d0,0);
  Node::Node((Node *)local_1b8,pvVar5);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&nodeModels.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"Model",
             (allocator<char> *)
             ((long)&nodeGeometry.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  findNodes((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_210,(Node *)local_118,&local_230)
  ;
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&nodeGeometry.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Geometry",
             (allocator<char> *)
             ((long)&nodeMaterials.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  findNodes((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_250,(Node *)local_118,&local_270)
  ;
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&nodeMaterials.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"Material",
             (allocator<char> *)
             ((long)&nodeTextures.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  findNodes((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_290,(Node *)local_118,&local_2b0)
  ;
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&nodeTextures.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"Texture",&local_2f1);
  findNodes((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_2d0,(Node *)local_118,&local_2f0)
  ;
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  __range1 = (vector<FBX::Node,_std::allocator<FBX::Node>_> *)0x0;
  textures.
  super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  textures.
  super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>::
  vector((vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_> *)
         &__range1);
  sVar6 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::size
                    ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_2d0);
  std::vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>::
  reserve((vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_> *)
          &__range1,sVar6);
  __end1 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::begin
                     ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_2d0);
  node = (Node *)std::vector<FBX::Node,_std::allocator<FBX::Node>_>::end
                           ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_2d0);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
                                     *)&node), bVar4) {
    pNVar8 = __gnu_cxx::
             __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
             ::operator*(&__end1);
    this_00 = (Texture *)operator_new(0x48);
    Texture::Texture(this_00,pNVar8);
    materials.
    super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
    std::vector<std::shared_ptr<FBX::Texture>,std::allocator<std::shared_ptr<FBX::Texture>>>::
    emplace_back<FBX::Texture*>
              ((vector<std::shared_ptr<FBX::Texture>,std::allocator<std::shared_ptr<FBX::Texture>>>
                *)&__range1,
               (Texture **)
               &materials.
                super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>::
    operator++(&__end1);
  }
  __range1_1 = (vector<FBX::Node,_std::allocator<FBX::Node>_> *)0x0;
  materials.
  super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  materials.
  super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>::
  vector((vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_> *
         )&__range1_1);
  sVar6 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::size
                    ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_290);
  std::vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>::
  reserve((vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
           *)&__range1_1,sVar6);
  __end1_1 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::begin
                       ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_290);
  node_1 = (Node *)std::vector<FBX::Node,_std::allocator<FBX::Node>_>::end
                             ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_290);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
                             *)&node_1), bVar4) {
    pNVar8 = __gnu_cxx::
             __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
             ::operator*(&__end1_1);
    this_01 = (Material *)operator_new(0xc0);
    Material::Material(this_01,pNVar8);
    meshes.
    super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_01;
    std::vector<std::shared_ptr<FBX::Material>,std::allocator<std::shared_ptr<FBX::Material>>>::
    emplace_back<FBX::Material*>
              ((vector<std::shared_ptr<FBX::Material>,std::allocator<std::shared_ptr<FBX::Material>>>
                *)&__range1_1,
               (Material **)
               &meshes.
                super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>::
    operator++(&__end1_1);
  }
  std::vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>::vector
            ((vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_> *)
             &__range1_2);
  __end1_2 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::begin
                       ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_250);
  node_2 = (Node *)std::vector<FBX::Node,_std::allocator<FBX::Node>_>::end
                             ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_250);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
                             *)&node_2), bVar4) {
    local_3c8._16_8_ =
         __gnu_cxx::
         __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>::
         operator*(&__end1_2);
    pvVar9 = std::
             vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](&((reference)local_3c8._16_8_)->properties,2);
    pbVar7 = std::
             get<std::__cxx11::string,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       (pvVar9);
    bVar4 = std::operator==(pbVar7,"Mesh");
    if (bVar4) {
      local_3d0 = 0.0;
      local_3d8 = (pointer)0x0;
      Vector3::Vector3((Vector3 *)&local_3d8);
      models.
      super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_3d8;
      up.z = local_3d0;
      up._0_8_ = local_3d8;
      parseMesh((Parser *)local_3c8,in_RSI,up);
      std::vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>::
      push_back((vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_> *)
                &__range1_2,(value_type *)local_3c8);
      std::shared_ptr<FBX::Mesh>::~shared_ptr((shared_ptr<FBX::Mesh> *)local_3c8);
    }
    __gnu_cxx::
    __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>::
    operator++(&__end1_2);
  }
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::vector
            ((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
             &__range1_3);
  sVar6 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::size
                    ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_210);
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::reserve
            ((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
             &__range1_3,sVar6);
  __end1_3 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::begin
                       ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_210);
  node_3 = (Node *)std::vector<FBX::Node,_std::allocator<FBX::Node>_>::end
                             ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_210);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
                             *)&node_3), bVar4) {
    local_420 = __gnu_cxx::
                __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
                ::operator*(&__end1_3);
    pvVar9 = std::
             vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](&local_420->properties,2);
    pbVar7 = std::
             get<std::__cxx11::string,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       (pvVar9);
    bVar4 = std::operator==(pbVar7,"Mesh");
    if (bVar4) {
      this_02 = (Model *)operator_new(0x28);
      Model::Model(this_02,local_420);
      __range1_4 = (vector<FBX::Node,_std::allocator<FBX::Node>_> *)this_02;
      std::vector<std::shared_ptr<FBX::Model>,std::allocator<std::shared_ptr<FBX::Model>>>::
      emplace_back<FBX::Model*>
                ((vector<std::shared_ptr<FBX::Model>,std::allocator<std::shared_ptr<FBX::Model>>> *)
                 &__range1_3,(Model **)&__range1_4);
    }
    __gnu_cxx::
    __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>::
    operator++(&__end1_3);
  }
  this_03 = (vector<FBX::Node,_std::allocator<FBX::Node>_> *)((long)&nodeConnections.id.field_2 + 8)
  ;
  __end1_4 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::begin(this_03);
  node_4 = (Node *)std::vector<FBX::Node,_std::allocator<FBX::Node>_>::end(this_03);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_4,
                            (__normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
                             *)&node_4), bVar4) {
    pNVar8 = __gnu_cxx::
             __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
             ::operator*(&__end1_4);
    pvVar9 = std::
             vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](&pNVar8->properties,1);
    plVar10 = std::
              get<long,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                        (pvVar9);
    lVar2 = *plVar10;
    pvVar9 = std::
             vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](&pNVar8->properties,2);
    plVar10 = std::
              get<long,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                        (pvVar9);
    lVar3 = *plVar10;
    __end2 = std::
             vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
             ::begin((vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
                      *)&__range1_1);
    material = (shared_ptr<FBX::Material> *)
               std::
               vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
               ::end((vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
                      *)&__range1_1);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<FBX::Material>_*,_std::vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>_>
                                       *)&material), bVar4) {
      this_04 = (__shared_ptr_access<FBX::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<FBX::Material>_*,_std::vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>_>
                ::operator*(&__end2);
      __end3 = std::
               vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
               ::begin((vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
                        *)&__range1);
      texture = (shared_ptr<FBX::Texture> *)
                std::
                vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
                ::end((vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
                       *)&__range1);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::shared_ptr<FBX::Texture>_*,_std::vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>_>
                                         *)&texture), bVar4) {
        this_05 = (__shared_ptr_access<FBX::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<FBX::Texture>_*,_std::vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>_>
                  ::operator*(&__end3);
        peVar11 = std::__shared_ptr_access<FBX::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(this_05);
        if ((lVar2 == (peVar11->super_Object).id) &&
           (peVar12 = std::
                      __shared_ptr_access<FBX::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(this_04), lVar3 == (peVar12->super_Object).id)) {
          peVar12 = std::
                    __shared_ptr_access<FBX::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(this_04);
          std::shared_ptr<FBX::Texture>::operator=
                    (&peVar12->texture,(shared_ptr<FBX::Texture> *)this_05);
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<FBX::Texture>_*,_std::vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>_>
        ::operator++(&__end3);
      }
      __end3_1 = std::
                 vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                 ::begin((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                          *)&__range1_3);
      model = (shared_ptr<FBX::Model> *)
              std::
              vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::
              end((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                   *)&__range1_3);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<std::shared_ptr<FBX::Model>_*,_std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>_>
                                 *)&model), bVar4) {
        this_06 = (__shared_ptr_access<FBX::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<FBX::Model>_*,_std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>_>
                  ::operator*(&__end3_1);
        peVar12 = std::__shared_ptr_access<FBX::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(this_04);
        if ((lVar2 == (peVar12->super_Object).id) &&
           (peVar14 = std::__shared_ptr_access<FBX::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(this_06), lVar3 == (peVar14->super_Object).id)) {
          peVar14 = std::__shared_ptr_access<FBX::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(this_06);
          std::shared_ptr<FBX::Material>::operator=
                    (&peVar14->material,(shared_ptr<FBX::Material> *)this_04);
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<FBX::Model>_*,_std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>_>
        ::operator++(&__end3_1);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<FBX::Material>_*,_std::vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>
               ::begin((vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>
                        *)&__range1_2);
    mesh = (shared_ptr<FBX::Mesh> *)
           std::vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>::
           end((vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_> *)
               &__range1_2);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::shared_ptr<FBX::Mesh>_*,_std::vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>_>
                               *)&mesh), bVar4) {
      this_07 = (__shared_ptr_access<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<FBX::Mesh>_*,_std::vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>_>
                ::operator*(&__end2_1);
      __end3_2 = std::
                 vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                 ::begin((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                          *)&__range1_3);
      model_1 = (shared_ptr<FBX::Model> *)
                std::
                vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::
                end((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                     *)&__range1_3);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<std::shared_ptr<FBX::Model>_*,_std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>_>
                                 *)&model_1), bVar4) {
        local_4f8 = (__shared_ptr_access<FBX::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    __gnu_cxx::
                    __normal_iterator<std::shared_ptr<FBX::Model>_*,_std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>_>
                    ::operator*(&__end3_2);
        peVar13 = std::__shared_ptr_access<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(this_07);
        if ((lVar2 == (peVar13->super_Object).id) &&
           (peVar14 = std::__shared_ptr_access<FBX::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(local_4f8), lVar3 == (peVar14->super_Object).id)) {
          peVar14 = std::__shared_ptr_access<FBX::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(local_4f8);
          std::shared_ptr<FBX::Mesh>::operator=(&peVar14->mesh,(shared_ptr<FBX::Mesh> *)this_07);
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<FBX::Model>_*,_std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>_>
        ::operator++(&__end3_2);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<FBX::Mesh>_*,_std::vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>_>
      ::operator++(&__end2_1);
    }
    __gnu_cxx::
    __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>::
    operator++(&__end1_4);
  }
  std::
  make_unique<FBX::Scene,std::vector<std::shared_ptr<FBX::Model>,std::allocator<std::shared_ptr<FBX::Model>>>&,FBX::Settings&>
            ((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
             &stack0xfffffffffffffb00,(Settings *)&__range1_3);
  std::unique_ptr<FBX::Scene_const,std::default_delete<FBX::Scene_const>>::
  unique_ptr<FBX::Scene,std::default_delete<FBX::Scene>,void>
            ((unique_ptr<FBX::Scene_const,std::default_delete<FBX::Scene_const>> *)this,
             (unique_ptr<FBX::Scene,_std::default_delete<FBX::Scene>_> *)&stack0xfffffffffffffb00);
  std::unique_ptr<FBX::Scene,_std::default_delete<FBX::Scene>_>::~unique_ptr
            ((unique_ptr<FBX::Scene,_std::default_delete<FBX::Scene>_> *)&stack0xfffffffffffffb00);
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::~vector
            ((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
             &__range1_3);
  std::vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>::~vector
            ((vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_> *)
             &__range1_2);
  std::vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>::
  ~vector((vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
           *)&__range1_1);
  std::vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>::
  ~vector((vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_> *)
          &__range1);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_2d0);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_290);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_250);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_210);
  Node::~Node((Node *)local_1b8);
  Node::~Node((Node *)local_118);
  return (__uniq_ptr_data<const_FBX::Scene,_std::default_delete<const_FBX::Scene>,_true,_true>)
         (__uniq_ptr_data<const_FBX::Scene,_std::default_delete<const_FBX::Scene>,_true,_true>)this;
}

Assistant:

std::unique_ptr<const Scene> Parser::parseScene() const {
        Settings settings(findNodes(root, "GlobalSettings")[0]);

        const auto nodeObjects = findNodes(root, "Objects")[0];
        const auto nodeConnections = findNodes(root, "Connections")[0];
        const auto nodeModels = findNodes(nodeObjects, "Model");
        const auto nodeGeometry = findNodes(nodeObjects, "Geometry");
        const auto nodeMaterials = findNodes(nodeObjects, "Material");
        const auto nodeTextures = findNodes(nodeObjects, "Texture");

        std::vector<std::shared_ptr<Texture>> textures{};
        textures.reserve(nodeTextures.size());
        for (const auto &node : nodeTextures)
            textures.emplace_back(new Texture(node));

        std::vector<std::shared_ptr<Material>> materials{};
        materials.reserve(nodeMaterials.size());
        for (const auto &node : nodeMaterials)
            materials.emplace_back(new Material(node));

        std::vector<std::shared_ptr<Mesh>> meshes;
        for (const auto &node : nodeGeometry)
            if (std::get<std::string>(node.properties[2]) == "Mesh")
                meshes.push_back(parseMesh(node, {})); // TODO

        std::vector<std::shared_ptr<Model>> models;
        models.reserve(nodeModels.size());
        for (const auto &node : nodeModels)
            if (std::get<std::string>(node.properties[2]) == "Mesh")
                models.emplace_back(new Model(node));

        for (const auto &node : nodeConnections.children) {
            const auto source = std::get<int64_t>(node.properties[1]);
            const auto target = std::get<int64_t>(node.properties[2]);

            for (const auto &material : materials) {
                for (const auto &texture : textures)
                    if (source == texture->id && target == material->id)
                        material->texture = texture;

                for (const auto &model : models)
                    if (source == material->id && target == model->id)
                        model->material = material;
            }

            for (const auto &mesh : meshes)
                for (const auto &model : models)
                    if (source == mesh->id && target == model->id)
                        model->mesh = mesh;
        }

        return std::make_unique<Scene>(models, settings);
    }